

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player-properties.c
# Opt level: O0

void view_ability_menu_browser(int oid,void *data,region *loc)

{
  player_ability *choices;
  region *loc_local;
  void *data_local;
  int oid_local;
  
  text_out_hook = text_out_to_screen;
  text_out_wrap = L'<';
  text_out_indent = loc->col + L'\xffffffff';
  text_out_pad = L'\x01';
  clear_from(loc->row + loc->page_rows);
  Term_gotoxy(loc->col,loc->row + loc->page_rows);
  text_out_c('\x0e',"\n%s\n",*(undefined8 *)((long)data + (long)oid * 0x30 + 0x20));
  text_out_pad = L'\0';
  text_out_indent = L'\0';
  text_out_wrap = L'\0';
  return;
}

Assistant:

static void view_ability_menu_browser(int oid, void *data, const region *loc)
{
	struct player_ability *choices = data;

	/* Redirect output to the screen */
	text_out_hook = text_out_to_screen;
	text_out_wrap = 60;
	text_out_indent = loc->col - 1;
	text_out_pad = 1;

	clear_from(loc->row + loc->page_rows);
	Term_gotoxy(loc->col, loc->row + loc->page_rows);
	text_out_c(COLOUR_L_BLUE, "\n%s\n", (char *) choices[oid].desc);

	/* XXX */
	text_out_pad = 0;
	text_out_indent = 0;
	text_out_wrap = 0;
}